

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall
soplex::SoPlexBase<double>::_solveRealLPAndRecordStatistics
          (SoPlexBase<double> *this,bool *interrupt)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  SPxSolverBase<double> *this_00;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Representation RVar6;
  Statistics *pSVar7;
  Type TVar8;
  int iVar9;
  Settings *pSVar10;
  int iVar11;
  Representation RVar12;
  Verbosity old_verbosity;
  bool bVar13;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar14;
  Real RVar15;
  double dVar16;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_68;
  double local_58;
  
  pSVar10 = this->_currentSettings;
  dVar14 = pSVar10->_realParamValues[6];
  if (dVar14 <= (double)pSVar10->_intParamValues[5]) {
    iVar9 = -1;
  }
  else {
    iVar11 = pSVar10->_intParamValues[5] - this->_statistics->iterations;
    iVar9 = -1;
    if (-1 < iVar11) {
      iVar9 = iVar11;
    }
  }
  bVar13 = this->_hasBasis;
  (this->_solver).maxIters = iVar9;
  dVar16 = pSVar10->_realParamValues[7];
  if (dVar16 < dVar14) {
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    dVar14 = dVar16 - extraout_XMM0_Qa;
  }
  RVar15 = 0.0;
  if (0.0 <= dVar14) {
    RVar15 = dVar14;
  }
  (this->_solver).maxTime = RVar15;
  this_00 = &this->_solver;
  dVar14 = SPxSolverBase<double>::epsilon(this_00);
  psVar1 = &this->_tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  local_58 = Tolerances::floatingPointFeastol(local_68._M_ptr);
  dVar14 = dVar14 * 10000.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  if (local_58 < dVar14) {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              );
    Tolerances::setFloatingPointFeastol(local_68._M_ptr,dVar14);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  }
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  local_58 = Tolerances::floatingPointOpttol(local_68._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  if (local_58 < dVar14) {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              );
    Tolerances::setFloatingPointOpttol(local_68._M_ptr,dVar14);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  }
  iVar9 = this->_currentSettings->_intParamValues[1];
  if (iVar9 == 2) {
    if ((this->_solver).theRep != ROW) {
LAB_00287e74:
      RVar12 = ROW;
LAB_00287e77:
      SPxSolverBase<double>::setRep(this_00,RVar12);
    }
  }
  else {
    RVar12 = COLUMN;
    if (iVar9 == 1) {
      if ((this->_solver).theRep != COLUMN) goto LAB_00287e77;
    }
    else if (iVar9 == 0) {
      dVar14 = (double)((this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                        super_SVSetBase<double>.set.thenum + 1) *
               this->_currentSettings->_realParamValues[0x10];
      dVar16 = (double)((this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set.thenum + 1);
      RVar6 = (this->_solver).theRep;
      if (RVar6 != COLUMN && dVar16 <= dVar14) goto LAB_00287e77;
      if (RVar6 != ROW && dVar14 < dVar16) goto LAB_00287e74;
    }
  }
  iVar9 = this->_currentSettings->_intParamValues[2];
  if (iVar9 == 1) {
    TVar8 = (this->_solver).theType;
    RVar12 = (this->_solver).theRep;
    if (TVar8 == ENTER || RVar12 != ROW) {
      if (RVar12 != COLUMN) goto LAB_00287eef;
      goto LAB_00287edb;
    }
LAB_00287ee4:
    TVar8 = ENTER;
  }
  else {
    if (iVar9 != 0) goto LAB_00287eef;
    TVar8 = (this->_solver).theType;
    RVar12 = (this->_solver).theRep;
    if (TVar8 != ENTER && RVar12 == COLUMN) goto LAB_00287ee4;
    if (RVar12 != ROW) goto LAB_00287eef;
LAB_00287edb:
    if (TVar8 == LEAVE) goto LAB_00287eef;
    TVar8 = LEAVE;
  }
  SPxSolverBase<double>::setType(this_00,TVar8);
LAB_00287eef:
  pSVar10 = this->_currentSettings;
  (this->_solver).sparsePricingFactor = pSVar10->_realParamValues[0xf];
  iVar9 = pSVar10->_intParamValues[0x14];
  if (iVar9 == 0) {
    (this->_solver).hyperPricingLeave = false;
    (this->_solver).hyperPricingEnter = false;
  }
  else if ((iVar9 == 2) ||
          ((iVar9 == 1 &&
           (5000 < (this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum +
                   (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum)))) {
    SPxSolverBase<double>::hyperPricing(this_00,true);
    pSVar10 = this->_currentSettings;
  }
  (this->_solver).super_SPxBasisBase<double>.nonzeroFactor = pSVar10->_realParamValues[0x13];
  (this->_solver).super_SPxBasisBase<double>.fillFactor = pSVar10->_realParamValues[0x14];
  (this->_solver).super_SPxBasisBase<double>.memFactor = pSVar10->_realParamValues[0x15];
  (*this->_statistics->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<double>::solve(this_00,interrupt,true);
  (*this->_statistics->simplexTime->_vptr_Timer[4])();
  iVar9 = (this->_solver).super_SPxBasisBase<double>.iterCount;
  if (0 < iVar9) {
    SLUFactorRational::clear(&this->_rationalLUSolver);
    iVar9 = (this->_solver).super_SPxBasisBase<double>.iterCount;
  }
  pSVar7 = this->_statistics;
  pSVar7->iterations = pSVar7->iterations + iVar9;
  iVar11 = iVar9;
  if (iVar9 != 0) {
    iVar11 = (this->_solver).primalCount;
  }
  pSVar7->iterationsPrimal = pSVar7->iterationsPrimal + iVar11;
  iVar11 = 0;
  if (bVar13 != false) {
    iVar11 = iVar9;
  }
  pSVar7->iterationsFromBasis = pSVar7->iterationsFromBasis + iVar11;
  pSVar7->iterationsPolish = pSVar7->iterationsPolish + (this->_solver).polishCount;
  pSVar7->boundflips = pSVar7->boundflips + (this->_solver).totalboundflips;
  (*((this->_solver).multTimeSparse)->_vptr_Timer[6])();
  this->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + this->_statistics->multTimeSparse;
  (*((this->_solver).multTimeFull)->_vptr_Timer[6])();
  this->_statistics->multTimeFull = extraout_XMM0_Qa_01 + this->_statistics->multTimeFull;
  (*((this->_solver).multTimeColwise)->_vptr_Timer[6])();
  this->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + this->_statistics->multTimeColwise;
  (*((this->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  pSVar7 = this->_statistics;
  pSVar7->multTimeUnsetup = extraout_XMM0_Qa_03 + pSVar7->multTimeUnsetup;
  uVar2 = (this->_solver).multSparseCalls;
  uVar3 = (this->_solver).multFullCalls;
  uVar4 = (this->_solver).multColwiseCalls;
  uVar5 = (this->_solver).multUnsetupCalls;
  pSVar7->multSparseCalls = pSVar7->multSparseCalls + uVar2;
  pSVar7->multFullCalls = pSVar7->multFullCalls + uVar3;
  pSVar7->multColwiseCalls = pSVar7->multColwiseCalls + uVar4;
  pSVar7->multUnsetupCalls = pSVar7->multUnsetupCalls + uVar5;
  (*((this->_slufactor).super_CLUFactor<double>.factorTime)->_vptr_Timer[6])();
  this->_statistics->luFactorizationTimeReal =
       extraout_XMM0_Qa_04 + this->_statistics->luFactorizationTimeReal;
  (*((this->_slufactor).solveTime)->_vptr_Timer[6])();
  pSVar7 = this->_statistics;
  pSVar7->luSolveTimeReal = extraout_XMM0_Qa_05 + pSVar7->luSolveTimeReal;
  pSVar7->luFactorizationsReal =
       pSVar7->luFactorizationsReal + (this->_slufactor).super_CLUFactor<double>.factorCount;
  pSVar7->luSolvesReal = pSVar7->luSolvesReal + (this->_slufactor).solveCount;
  SLUFactor<double>::resetCounters(&this->_slufactor);
  bVar13 = (this->_solver).theRep == ROW;
  pSVar7 = this->_statistics;
  pSVar7->degenPivotsPrimal = pSVar7->degenPivotsPrimal + (&(this->_solver).enterCycles)[bVar13];
  pSVar7->degenPivotsDual = pSVar7->degenPivotsDual + (&(this->_solver).enterCycles)[!bVar13];
  dVar14 = (this->_solver).primalDegenSum;
  pSVar7->sumDualDegen = pSVar7->sumDualDegen + (this->_solver).dualDegenSum;
  pSVar7->sumPrimalDegen = pSVar7->sumPrimalDegen + dVar14;
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}